

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<bool_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<bool_const&> *this,bool *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest *this_00;
  size_type sVar2;
  char *pcVar3;
  bool *in_R8;
  bool bVar4;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  string local_98;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  undefined1 local_58;
  char *local_50;
  size_type local_48;
  char local_40 [8];
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  this_00 = *(lest **)this;
  bVar4 = *this_00 == (lest)*rhs;
  local_b8 = local_a8;
  local_58 = bVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"==","");
  if (local_b8 == local_a8) {
    uStack_60 = uStack_a0;
    local_78 = local_68;
  }
  else {
    local_78 = local_b8;
  }
  local_70 = local_b0;
  local_b0 = 0;
  local_a8[0] = 0;
  local_b8 = local_a8;
  to_string<bool,bool>(&local_98,this_00,(bool *)&local_78,(string *)rhs,in_R8);
  sVar2 = local_98._M_string_length;
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    uStack_38 = local_98.field_2._8_4_;
    uStack_34 = local_98.field_2._12_4_;
    local_98._M_dataplus._M_p = local_40;
  }
  local_48 = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity._0_4_ =
       local_98.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  __return_storage_ptr__->passed = bVar4;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  pcVar3 = local_98._M_dataplus._M_p + sVar2;
  local_50 = local_98._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,pcVar3);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result{ lhs <= rhs, to_string( lhs, "<=", rhs ) }; }